

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

bool __thiscall cursespp::Window::IsParentVisible(Window *this)

{
  int iVar1;
  undefined4 extraout_var;
  _func_int **pp_Var2;
  
  if (this->parent == (IWindow *)0x0) {
    return true;
  }
  pp_Var2 = (this->super_IWindow).super_IOrderable._vptr_IOrderable;
  while( true ) {
    iVar1 = (*pp_Var2[0x25])(this);
    this = (Window *)CONCAT44(extraout_var,iVar1);
    if (this == (Window *)0x0) {
      return this == (Window *)0x0;
    }
    iVar1 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x23])(this);
    if ((char)iVar1 == '\0') break;
    pp_Var2 = (this->super_IWindow).super_IOrderable._vptr_IOrderable;
  }
  return false;
}

Assistant:

bool Window::IsParentVisible() {
    ASSERT_MAIN_THREAD();

    if (this->parent == nullptr) {
        return true;
    }

    auto p = this->GetParent();
    while (p) {
        if (!p->IsVisible()) {
            return false;
        }
        p = p->GetParent();
    }

    return true;
}